

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void encode_minimalExample_isSuccessful(void)

{
  bech32_error bVar1;
  int iVar2;
  size_t hrplen;
  bech32_bstring *bstring;
  uchar dp [1];
  char hrp [2];
  uchar local_1b;
  char local_1a [2];
  
  local_1a[0] = 'a';
  local_1a[1] = '\0';
  local_1b = '\0';
  hrplen = strlen(local_1a);
  bstring = bech32_create_bstring(hrplen,0);
  bVar1 = bech32_encode(bstring,local_1a,&local_1b,0);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_encode(bstring, hrp, dp, 0) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x10f,"void encode_minimalExample_isSuccessful(void)");
  }
  iVar2 = strcmp("a1lqfn3a",bstring->string);
  if (iVar2 == 0) {
    bech32_free_bstring(bstring);
    return;
  }
  __assert_fail("strcmp(expected, bstring->string) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x110,"void encode_minimalExample_isSuccessful(void)");
}

Assistant:

void encode_minimalExample_isSuccessful(void) {
    char hrp[] = "a";
    unsigned char dp[] = {0}; // C doesn't allow zero-length arrays
    char expected[] = "a1lqfn3a";
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), 0);

    assert(bech32_encode(bstring, hrp, dp, 0) == E_BECH32_SUCCESS);
    assert(strcmp(expected, bstring->string) == 0);

    bech32_free_bstring(bstring);
}